

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signmessage.cpp
# Opt level: O2

void RegisterSignMessageRPCCommands(CRPCTable *t)

{
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff88;
  string local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterSignMessageRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterSignMessageRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_48,"util",(allocator<char> *)&stack0xffffffffffffff97);
      CRPCCommand::CRPCCommand
                (RegisterSignMessageRPCCommands::commands,in_stack_ffffffffffffff88,
                 (RpcMethodFnType)local_48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff98,"util",
                 (allocator<char> *)&stack0xffffffffffffff96);
      CRPCCommand::CRPCCommand
                (RegisterSignMessageRPCCommands::commands + 1,in_stack_ffffffffffffff88,
                 (RpcMethodFnType)&stack0xffffffffffffff98);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
      std::__cxx11::string::~string(local_48);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterSignMessageRPCCommands(CRPCTable&)::commands);
    }
  }
  pcmd = RegisterSignMessageRPCCommands::commands;
  for (lVar2 = 0x100; lVar2 != 0; lVar2 = lVar2 + -0x80) {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterSignMessageRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"util", &verifymessage},
        {"util", &signmessagewithprivkey},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}